

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaSampleFormat GetAvailableFormats(snd_pcm_t *pcm)

{
  long lVar1;
  size_t sVar2;
  PaSampleFormat PVar3;
  int iVar4;
  size_t __n;
  undefined8 uStack_30;
  size_t local_28;
  size_t __alsa_alloca_size;
  snd_pcm_hw_params_t *hwParams;
  PaSampleFormat available;
  snd_pcm_t *pcm_local;
  
  hwParams = (snd_pcm_hw_params_t *)0x0;
  uStack_30 = 0x10deed;
  available = (PaSampleFormat)pcm;
  __n = (*(code *)alsa_snd_pcm_hw_params_sizeof)();
  lVar1 = -(__n + 0xf & 0xfffffffffffffff0);
  local_28 = __n;
  __alsa_alloca_size = (size_t)((long)&local_28 + lVar1);
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x10df19;
  memset((void *)((long)&local_28 + lVar1),0,__n);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x10df2a;
  (*(code *)alsa_snd_pcm_hw_params_any)(PVar3,sVar2);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x10df40;
  iVar4 = (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0xe);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  if (-1 < iVar4) {
    hwParams = (snd_pcm_hw_params_t *)((ulong)hwParams | 1);
  }
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x10df67;
  iVar4 = (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,10);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  if (-1 < iVar4) {
    hwParams = (snd_pcm_hw_params_t *)((ulong)hwParams | 2);
  }
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x10df8e;
  iVar4 = (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x20);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  if (-1 < iVar4) {
    hwParams = (snd_pcm_hw_params_t *)((ulong)hwParams | 4);
  }
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x10dfb5;
  iVar4 = (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,2);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  if (-1 < iVar4) {
    hwParams = (snd_pcm_hw_params_t *)((ulong)hwParams | 8);
  }
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x10dfdc;
  iVar4 = (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,1);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  if (-1 < iVar4) {
    hwParams = (snd_pcm_hw_params_t *)((ulong)hwParams | 0x20);
  }
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x10e000;
  iVar4 = (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0);
  if (-1 < iVar4) {
    hwParams = (snd_pcm_hw_params_t *)((ulong)hwParams | 0x10);
  }
  return (PaSampleFormat)hwParams;
}

Assistant:

static PaSampleFormat GetAvailableFormats( snd_pcm_t *pcm )
{
    PaSampleFormat available = 0;
    snd_pcm_hw_params_t *hwParams;
    alsa_snd_pcm_hw_params_alloca( &hwParams );

    alsa_snd_pcm_hw_params_any( pcm, hwParams );

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT ) >= 0)
        available |= paFloat32;

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S32 ) >= 0)
        available |= paInt32;

#ifdef PA_LITTLE_ENDIAN
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_3LE ) >= 0)
        available |= paInt24;
#elif defined PA_BIG_ENDIAN
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_3BE ) >= 0)
        available |= paInt24;
#endif

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S16 ) >= 0)
        available |= paInt16;

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U8 ) >= 0)
        available |= paUInt8;

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S8 ) >= 0)
        available |= paInt8;

    return available;
}